

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::PrimitiveColumnWriter::Prepare
          (PrimitiveColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  ValidityMask *validity;
  int64_t *piVar1;
  pointer *this_00;
  uint16_t define_value;
  idx_t iVar2;
  unsigned_long *puVar3;
  iterator __position;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar9;
  size_type __n;
  ulong uVar10;
  unsigned_long val;
  PageInformation *page_info;
  reference rVar11;
  PageInformation new_info;
  PageInformation local_58;
  
  pvVar6 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                     ((vector<duckdb_parquet::ColumnChunk,_true> *)
                      (state_p[1].definition_levels.
                       super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),
                      (size_type)
                      state_p[1].definition_levels.
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (parent == (ColumnWriterState *)0x0) {
    __n = (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
    val = count;
  }
  else {
    __n = (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
    val = ((long)(parent->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(parent->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start >> 1) - __n;
  }
  FlatVector::VerifyFlatVector(vector);
  validity = &vector->validity;
  ColumnWriter::HandleRepeatLevels
            (&this->super_ColumnWriter,state_p,parent,count,
             ((this->super_ColumnWriter).column_schema)->max_repeat);
  define_value = (uint16_t)((this->super_ColumnWriter).column_schema)->max_define;
  ColumnWriter::HandleDefineLevels
            (&this->super_ColumnWriter,state_p,parent,validity,count,define_value,define_value - 1);
  this_00 = &state_p[1].definition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pvVar7 = vector<duckdb::PageInformation,_true>::back
                     ((vector<duckdb::PageInformation,_true> *)this_00);
  lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
  piVar1 = &(pvVar6->meta_data).num_values;
  *piVar1 = *piVar1 + lVar8;
  if ((parent == (ColumnWriterState *)0x0) ||
     ((bVar4 = true,
      (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p ==
      (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p &&
      ((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_offset == 0)))) {
    if (((validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) && (bVar4 = TypeIsConstantSize((vector->type).physical_type_), bVar4)
       ) {
      iVar2 = pvVar7->estimated_page_size;
      bVar4 = false;
      iVar5 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xe])(this,vector,0,state_p);
      if (CONCAT44(extraout_var,iVar5) * val + iVar2 < 0x6400000) {
        pvVar7->row_count = pvVar7->row_count + val;
        iVar5 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xe])(this,vector,0,state_p);
        pvVar7->estimated_page_size =
             pvVar7->estimated_page_size + CONCAT44(extraout_var_00,iVar5) * val;
        return;
      }
    }
    else {
      bVar4 = false;
    }
  }
  if (val != 0) {
    uVar10 = 0;
    do {
      pvVar7->row_count = pvVar7->row_count + 1;
      if ((bVar4) &&
         (rVar11 = vector<bool,_true>::get<true>(&parent->is_empty,__n),
         (*rVar11._M_p & rVar11._M_mask) != 0)) {
        pvVar7->empty_count = pvVar7->empty_count + 1;
      }
      else {
        puVar3 = (validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
        {
          iVar5 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xe])(this,vector,uVar10,state_p);
          uVar9 = CONCAT44(extraout_var_01,iVar5) + pvVar7->estimated_page_size;
          pvVar7->estimated_page_size = uVar9;
          if (0x63fffff < uVar9) {
            local_58.empty_count = 0;
            local_58.estimated_page_size = 0;
            local_58.row_count = 0;
            local_58.null_count = 0;
            local_58.offset = pvVar7->row_count + pvVar7->offset;
            __position._M_current =
                 (PageInformation *)
                 state_p[1].repetition_levels.
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
            if (__position._M_current ==
                (PageInformation *)
                state_p[1].repetition_levels.
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ::std::vector<duckdb::PageInformation,std::allocator<duckdb::PageInformation>>::
              _M_realloc_insert<duckdb::PageInformation_const&>
                        ((vector<duckdb::PageInformation,std::allocator<duckdb::PageInformation>> *)
                         this_00,__position,&local_58);
            }
            else {
              (__position._M_current)->null_count = 0;
              (__position._M_current)->empty_count = 0;
              (__position._M_current)->estimated_page_size = 0;
              (__position._M_current)->offset = local_58.offset;
              (__position._M_current)->row_count = 0;
              state_p[1].repetition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start =
                   state_p[1].repetition_levels.
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x14;
            }
            pvVar7 = vector<duckdb::PageInformation,_true>::back
                               ((vector<duckdb::PageInformation,_true> *)this_00);
          }
        }
        else {
          pvVar7->null_count = pvVar7->null_count + 1;
        }
        uVar10 = uVar10 + 1;
      }
      __n = __n + 1;
      val = val - 1;
    } while (val != 0);
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector,
                                    idx_t count) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();
	auto &col_chunk = state.row_group.columns[state.col_idx];

	idx_t vcount = parent ? parent->definition_levels.size() - state.definition_levels.size() : count;
	idx_t parent_index = state.definition_levels.size();
	auto &validity = FlatVector::Validity(vector);
	HandleRepeatLevels(state, parent, count, MaxRepeat());
	HandleDefineLevels(state, parent, validity, count, MaxDefine(), MaxDefine() - 1);

	idx_t vector_index = 0;
	reference<PageInformation> page_info_ref = state.page_info.back();
	col_chunk.meta_data.num_values += NumericCast<int64_t>(vcount);

	const bool check_parent_empty = parent && !parent->is_empty.empty();
	if (!check_parent_empty && validity.AllValid() && TypeIsConstantSize(vector.GetType().InternalType()) &&
	    page_info_ref.get().estimated_page_size + GetRowSize(vector, vector_index, state) * vcount <
	        MAX_UNCOMPRESSED_PAGE_SIZE) {
		// Fast path: fixed-size type, all valid, and it fits on the current page
		auto &page_info = page_info_ref.get();
		page_info.row_count += vcount;
		page_info.estimated_page_size += GetRowSize(vector, vector_index, state) * vcount;
	} else {
		for (idx_t i = 0; i < vcount; i++) {
			auto &page_info = page_info_ref.get();
			page_info.row_count++;
			if (check_parent_empty && parent->is_empty[parent_index + i]) {
				page_info.empty_count++;
				continue;
			}
			if (validity.RowIsValid(vector_index)) {
				page_info.estimated_page_size += GetRowSize(vector, vector_index, state);
				if (page_info.estimated_page_size >= MAX_UNCOMPRESSED_PAGE_SIZE) {
					PageInformation new_info;
					new_info.offset = page_info.offset + page_info.row_count;
					state.page_info.push_back(new_info);
					page_info_ref = state.page_info.back();
				}
			} else {
				page_info.null_count++;
			}
			vector_index++;
		}
	}
}